

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::operator%(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  logic_t lVar4;
  bool bVar5;
  SVInt *in_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  SVInt *pSVar7;
  bool bVar8;
  SVInt SVar9;
  SVInt local_68;
  SVInt local_58;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  SVInt local_40;
  
  bVar8 = (bool)((in_RDX->super_SVIntStorage).signFlag & (rhs->super_SVIntStorage).signFlag);
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  uVar3 = (in_RDX->super_SVIntStorage).bitWidth;
  if (uVar2 == uVar3) {
    bVar5 = (rhs->super_SVIntStorage).unknownFlag;
    bVar1 = (in_RDX->super_SVIntStorage).unknownFlag;
    local_48 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this;
    SVInt<int>(&local_68,0);
    lVar4 = operator==(in_RDX,&local_68);
    ~SVInt(&local_68);
    this = (SVInt *)local_48;
    if (((bVar5 != false) || ((bVar1 & 1U) != 0)) ||
       ((lVar4.value != '\0' && ((lVar4.value != '@' && (lVar4.value != 0x80)))))) {
      SVar9 = createFillX((SVInt *)local_48.pVal,(rhs->super_SVIntStorage).bitWidth,bVar8);
      uVar6 = SVar9.super_SVIntStorage._8_8_;
      goto LAB_001782b1;
    }
    if (bVar8 != false) {
      bVar8 = isNegative(rhs);
      bVar5 = isNegative(in_RDX);
      if (bVar8) {
        if (bVar5) {
          operator-(&local_58);
          operator-(&local_40);
          urem(&local_68,&local_58,&local_40,true);
          operator-(this);
          ~SVInt(&local_68);
          pSVar7 = &local_40;
        }
        else {
          operator-(&local_58);
          urem(&local_68,&local_58,in_RDX,true);
          operator-(this);
          pSVar7 = &local_68;
        }
        ~SVInt(pSVar7);
        pSVar7 = &local_58;
        goto LAB_001782ac;
      }
      if (bVar5) {
        operator-(&local_68);
        urem(this,rhs,&local_68,true);
        goto LAB_001782a7;
      }
    }
    SVar9 = urem(this,rhs,in_RDX,false);
    uVar6 = SVar9.super_SVIntStorage._8_8_;
  }
  else {
    if (uVar2 < uVar3) {
      extend(&local_68,(bitwidth_t)rhs,SUB41(uVar3,0));
      operator%(this,&local_68);
    }
    else {
      extend(&local_68,(bitwidth_t)in_RDX,SUB41(uVar2,0));
      operator%(this,rhs);
    }
LAB_001782a7:
    pSVar7 = &local_68;
LAB_001782ac:
    ~SVInt(pSVar7);
    uVar6 = extraout_RDX;
  }
LAB_001782b1:
  SVar9.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar9.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar9.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar9.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar9.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar9.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator%(const SVInt& rhs) const {
    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) % rhs;
        else
            return *this % rhs.extend(bitWidth, bothSigned);
    }

    // Any X's mean all X's; also dividing by zero does the same
    if (unknownFlag || rhs.unknownFlag || rhs == 0)
        return createFillX(bitWidth, bothSigned);

    // handle signed remainder
    if (bothSigned) {
        // do the remainder on positive numbers and flip the sign at the end
        if (isNegative()) {
            if (rhs.isNegative())
                return -urem(-(*this), -rhs, true);
            return -urem(-(*this), rhs, true);
        }
        if (rhs.isNegative())
            return urem(*this, -rhs, true);
    }

    // otherwise, just do the remainder
    return urem(*this, rhs, false);
}